

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_read_corrupt_utf8(void)

{
  long lVar1;
  char *pcVar2;
  uint local_218;
  uint local_214;
  bson_error_t error;
  char *bad_value;
  char *bad_key;
  
  error.message._496_8_ = anon_var_dwarf_c799;
  memset(&local_218,0,0x200);
  lVar1 = bson_new_from_json(anon_var_dwarf_c78d,0xffffffffffffffff,&local_218);
  if (lVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x41d,"test_bson_json_read_corrupt_utf8",
            "!bson_new_from_json ((uint8_t *) bad_key, -1, &error)");
    abort();
  }
  if (local_218 != 1) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_218,"==",1,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x421,"test_bson_json_read_corrupt_utf8");
    abort();
  }
  if (local_214 != 1) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_214,"==",1,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x421,"test_bson_json_read_corrupt_utf8");
    abort();
  }
  pcVar2 = strstr((char *)&error,"invalid bytes in UTF8 string");
  if (pcVar2 == (char *)0x0) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",&error,
            "invalid bytes in UTF8 string");
    abort();
  }
  lVar1 = bson_new_from_json(error.message._496_8_,0xffffffffffffffff,&local_218);
  if (lVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x423,"test_bson_json_read_corrupt_utf8",
            "!bson_new_from_json ((uint8_t *) bad_value, -1, &error)");
    abort();
  }
  if (local_218 != 1) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_218,"==",1,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x427,"test_bson_json_read_corrupt_utf8");
    abort();
  }
  if (local_214 != 1) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_214,"==",1,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x427,"test_bson_json_read_corrupt_utf8");
    abort();
  }
  pcVar2 = strstr((char *)&error,"invalid bytes in UTF8 string");
  if (pcVar2 == (char *)0x0) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",&error,
            "invalid bytes in UTF8 string");
    abort();
  }
  return;
}

Assistant:

static void
test_bson_json_read_corrupt_utf8 (void)
{
   const char *bad_key = "{ \"\x80\" : \"a\"}";
   const char *bad_value = "{ \"a\" : \"\x80\"}";
   bson_error_t error = {0};

   BSON_ASSERT (!bson_new_from_json ((uint8_t *) bad_key, -1, &error));
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_CORRUPT_JS,
                          "invalid bytes in UTF8 string");

   BSON_ASSERT (!bson_new_from_json ((uint8_t *) bad_value, -1, &error));
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_CORRUPT_JS,
                          "invalid bytes in UTF8 string");
}